

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

void us_internal_loop_data_init
               (us_loop_t *loop,_func_void_us_loop_t_ptr *wakeup_cb,_func_void_us_loop_t_ptr *pre_cb
               ,_func_void_us_loop_t_ptr *post_cb)

{
  us_timer_t *puVar1;
  void *pvVar2;
  us_internal_async *puVar3;
  us_internal_async *in_RCX;
  undefined8 in_RDX;
  us_loop_t *in_RSI;
  undefined8 *in_RDI;
  _func_void_us_internal_async_ptr *in_stack_ffffffffffffffd8;
  
  puVar1 = us_create_timer(in_RSI,(int)((ulong)in_RDX >> 0x20),(uint)in_RDX);
  *in_RDI = puVar1;
  pvVar2 = malloc(0x80040);
  in_RDI[5] = pvVar2;
  in_RDI[6] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[9] = 0;
  in_RDI[7] = in_RDX;
  in_RDI[8] = in_RCX;
  in_RDI[10] = 0;
  puVar3 = us_internal_create_async(in_RSI,(int)((ulong)in_RDX >> 0x20),(uint)in_RDX);
  in_RDI[1] = puVar3;
  us_internal_async_set(in_RCX,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void us_internal_loop_data_init(struct us_loop_t *loop, void (*wakeup_cb)(struct us_loop_t *loop),
    void (*pre_cb)(struct us_loop_t *loop), void (*post_cb)(struct us_loop_t *loop)) {
    loop->data.sweep_timer = us_create_timer(loop, 1, 0);
    loop->data.recv_buf = malloc(LIBUS_RECV_BUFFER_LENGTH + LIBUS_RECV_BUFFER_PADDING * 2);
    loop->data.ssl_data = 0;
    loop->data.head = 0;
    loop->data.iterator = 0;
    loop->data.closed_head = 0;

    loop->data.pre_cb = pre_cb;
    loop->data.post_cb = post_cb;
    loop->data.iteration_nr = 0;

    loop->data.wakeup_async = us_internal_create_async(loop, 1, 0);
    us_internal_async_set(loop->data.wakeup_async, (void (*)(struct us_internal_async *)) wakeup_cb);
}